

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sturm.h
# Opt level: O0

int find_real_roots_sturm(double *p,int order,double *roots,int *nroots,int maxpow,bool non_neg)

{
  double dVar1;
  int iVar2;
  int local_8694;
  double dStack_8690;
  int i_1;
  double mult;
  double fac;
  double val0;
  double norm;
  int local_8668;
  int atmax;
  int atmin;
  int np;
  int nchanges;
  int i;
  double max;
  double min;
  poly sseq [65];
  bool non_neg_local;
  int maxpow_local;
  int *nroots_local;
  double *roots_local;
  int order_local;
  double *p_local;
  
  dVar1 = p[order];
  for (np = 0; np <= order; np = np + 1) {
    sseq[0].coef[(long)np + -1] = p[np] * (1.0 / dVar1);
  }
  mult = 1.0;
  sseq[0x40].coef[0x40]._3_1_ = non_neg;
  sseq[0x40].coef[0x40]._4_4_ = maxpow;
  if (10.0 < ABS((double)sseq[0]._0_8_)) {
    mult = pow(ABS((double)sseq[0]._0_8_),-1.0 / (double)order);
    dStack_8690 = mult;
    for (local_8694 = order + -1; -1 < local_8694; local_8694 = local_8694 + -1) {
      sseq[0].coef[(long)local_8694 + -1] = dStack_8690 * sseq[0].coef[(long)local_8694 + -1];
      dStack_8690 = dStack_8690 * mult;
    }
  }
  atmax = buildsturm(order,(poly *)&min);
  iVar2 = numroots(atmax,(poly *)&min,&local_8668,(int *)((long)&norm + 4),
                   (bool)(sseq[0x40].coef[0x40]._3_1_ & 1));
  *nroots = iVar2;
  if (*nroots == 0) {
    p_local._4_4_ = 0;
  }
  else {
    if ((sseq[0x40].coef[0x40]._3_1_ & 1) == 0) {
      max = -1.0;
      atmin = numchanges(atmax,(poly *)&min,-1.0);
      for (np = 0; atmin != local_8668 && np != sseq[0x40].coef[0x40]._4_4_; np = np + 1) {
        max = max * 10.0;
        atmin = numchanges(atmax,(poly *)&min,max);
      }
      if (atmin != local_8668) {
        local_8668 = atmin;
      }
    }
    else {
      max = 0.0;
    }
    _nchanges = 1.0;
    atmin = numchanges(atmax,(poly *)&min,1.0);
    for (np = 0; atmin != norm._4_4_ && np != sseq[0x40].coef[0x40]._4_4_; np = np + 1) {
      _nchanges = _nchanges * 10.0;
      atmin = numchanges(atmax,(poly *)&min,_nchanges);
    }
    if (atmin != norm._4_4_) {
      norm._4_4_ = atmin;
    }
    *nroots = local_8668 - norm._4_4_;
    sbisect(atmax,(poly *)&min,max,_nchanges,local_8668,norm._4_4_,roots);
    for (np = 0; np < *nroots; np = np + 1) {
      roots[np] = roots[np] / mult;
    }
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int find_real_roots_sturm(
	double *p, int order, double *roots, int *nroots, int maxpow, bool non_neg)
{
	/*
	* finds the roots of the input polynomial.  They are returned in roots.
	* It is assumed that roots is already allocated with space for the roots.
	*/

	poly sseq[MAX_DEG + 1];
	double  min, max;
	int  i, nchanges, np, atmin, atmax;

	// Copy the coefficients from the input p.  Normalize as we go
	double norm = 1.0 / p[order];
	for (i = 0; i <= order; i++)
		sseq[0].coef[i] = p[i] * norm;

	// Now, also normalize the other terms
	double val0 = fabs(sseq[0].coef[0]);
	double fac = 1.0; // This will be a factor for the roots
	if (val0 > 10.0)  // Do this in case there are zero roots
	{
		fac = pow(val0, -1.0 / order);
		double mult = fac;
		for (int i = order - 1; i >= 0; i--)
		{
			sseq[0].coef[i] *= mult;
			mult = mult * fac;
		}
	}

	/* build the Sturm sequence */
	np = buildsturm(order, sseq);

#ifdef RH_DEBUG
	{
		int i, j;

		printf("Sturm sequence for:\n");
		for (i = order; i >= 0; i--)
			printf("%lf ", sseq[0].coef[i]);
		printf("\n\n");

		for (i = 0; i <= np; i++) {
			for (j = sseq[i].ord; j >= 0; j--)
				printf("%10f ", sseq[i].coef[j]);
			printf("\n");
		}

		printf("\n");
	}
#endif

	// get the number of real roots
	*nroots = numroots(np, sseq, &atmin, &atmax, non_neg);

	if (*nroots == 0) {
		// fprintf(stderr, "solve: no real roots\n");
		return 0;
	}

	/* calculate the bracket that the roots live in */
	if (non_neg) min = 0.0;
	else
	{
		min = -1.0;
		nchanges = numchanges(np, sseq, min);
		for (i = 0; nchanges != atmin && i != maxpow; i++) {
			min *= 10.0;
			nchanges = numchanges(np, sseq, min);
		}

		if (nchanges != atmin) {
			//printf("solve: unable to bracket all negative roots\n");
			atmin = nchanges;
		}
	}

	max = 1.0;
	nchanges = numchanges(np, sseq, max);
	for (i = 0; nchanges != atmax && i != maxpow; i++) {
		max *= 10.0;
		nchanges = numchanges(np, sseq, max);
	}

	if (nchanges != atmax) {
		//printf("solve: unable to bracket all positive roots\n");
		atmax = nchanges;
	}

	*nroots = atmin - atmax;

	/* perform the bisection */
	sbisect(np, sseq, min, max, atmin, atmax, roots);

	/* Finally, reorder the roots */
	for (i = 0; i<*nroots; i++)
		roots[i] /= fac;

#ifdef RH_DEBUG

	/* write out the roots */
	printf("Number of roots = %d\n", *nroots);
	for (i = 0; i<*nroots; i++)
		printf("%12.5e\n", roots[i]);

#endif

	return 1;
}